

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

CURLcode pausewrite(Curl_easy *data,int type,char *ptr,size_t len)

{
  uint *puVar1;
  int *piVar2;
  CURLcode CVar3;
  char *pcVar4;
  void *pvVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  
  uVar6 = (ulong)(data->state).tempcount;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    for (lVar8 = 0; uVar6 * 0x18 - lVar8 != 0; lVar8 = lVar8 + 0x18) {
      if (*(int *)((long)&(data->state).tempwrite[0].type + lVar8) == type) {
        sVar7 = *(long *)((long)&(data->state).tempwrite[0].len + lVar8) + len;
        pvVar5 = (*Curl_crealloc)(*(void **)((long)&(data->state).tempwrite[0].buf + lVar8),sVar7);
        if (pvVar5 == (void *)0x0) goto LAB_00114192;
        memcpy((void *)(*(long *)((long)&(data->state).tempwrite[0].len + lVar8) + (long)pvVar5),ptr
               ,len);
        *(void **)((long)&(data->state).tempwrite[0].buf + lVar8) = pvVar5;
        *(size_t *)((long)&(data->state).tempwrite[0].len + lVar8) = sVar7;
        goto LAB_00114187;
      }
    }
  }
  pcVar4 = (char *)Curl_memdup(ptr,len);
  if (pcVar4 == (char *)0x0) {
LAB_00114192:
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    (data->state).tempwrite[uVar6].buf = pcVar4;
    (data->state).tempwrite[uVar6].len = len;
    (data->state).tempwrite[uVar6].type = type;
    puVar1 = &(data->state).tempcount;
    *puVar1 = *puVar1 + 1;
LAB_00114187:
    piVar2 = &(data->req).keepon;
    *(byte *)piVar2 = (byte)*piVar2 | 0x10;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode pausewrite(struct Curl_easy *data,
                           int type, /* what type of data */
                           const char *ptr,
                           size_t len)
{
  /* signalled to pause sending on this connection, but since we have data
     we want to send we need to dup it to save a copy for when the sending
     is again enabled */
  struct SingleRequest *k = &data->req;
  struct UrlState *s = &data->state;
  char *dupl;
  unsigned int i;
  bool newtype = TRUE;

  if(s->tempcount) {
    for(i = 0; i< s->tempcount; i++) {
      if(s->tempwrite[i].type == type) {
        /* data for this type exists */
        newtype = FALSE;
        break;
      }
    }
    DEBUGASSERT(i < 3);
  }
  else
    i = 0;

  if(!newtype) {
    /* append new data to old data */

    /* figure out the new size of the data to save */
    size_t newlen = len + s->tempwrite[i].len;
    /* allocate the new memory area */
    char *newptr = realloc(s->tempwrite[i].buf, newlen);
    if(!newptr)
      return CURLE_OUT_OF_MEMORY;
    /* copy the new data to the end of the new area */
    memcpy(newptr + s->tempwrite[i].len, ptr, len);

    /* update the pointer and the size */
    s->tempwrite[i].buf = newptr;
    s->tempwrite[i].len = newlen;
  }
  else {
    dupl = Curl_memdup(ptr, len);
    if(!dupl)
      return CURLE_OUT_OF_MEMORY;

    /* store this information in the state struct for later use */
    s->tempwrite[i].buf = dupl;
    s->tempwrite[i].len = len;
    s->tempwrite[i].type = type;

    if(newtype)
      s->tempcount++;
  }

  /* mark the connection as RECV paused */
  k->keepon |= KEEP_RECV_PAUSE;

  DEBUGF(infof(data, "Paused %zu bytes in buffer for type %02x\n",
               len, type));

  return CURLE_OK;
}